

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

SymbolTable * make_symbol_table(void)

{
  SymbolTable *pSVar1;
  Bucket *pBVar2;
  long lVar3;
  
  pSVar1 = (SymbolTable *)malloc(0x7e8);
  lVar3 = 0;
  do {
    pBVar2 = (Bucket *)malloc(0x78);
    pSVar1->bucket[lVar3] = pBVar2;
    pBVar2->num_symbols = 0;
    pBVar2->max_symbols = 7;
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 0xfd);
  return pSVar1;
}

Assistant:

SymbolTable *
make_symbol_table (void)
{
  SymbolTable *s = malloc (sizeof (SymbolTable));
  Bucket **b;
  int i;

  for (i = 0, b = &s->bucket[0]; i < HASH_BUCKETS; i++, b++)
    {
      *b = (Bucket *) malloc (sizeof (Bucket));
      (*b)->num_symbols = 0;
      (*b)->max_symbols = INITIAL_SYMBOLS;
    }

  return s;
}